

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int match_class(int c,int cl)

{
  int iVar1;
  uint local_24;
  uint local_18;
  int res;
  int cl_local;
  int c_local;
  
  iVar1 = tolower(cl);
  switch(iVar1) {
  case 0x61:
    local_18 = isalpha(c);
    break;
  default:
    return (uint)(cl == c);
  case 99:
    local_18 = iscntrl(c);
    break;
  case 100:
    local_18 = isdigit(c);
    break;
  case 0x67:
    local_18 = isgraph(c);
    break;
  case 0x6c:
    local_18 = islower(c);
    break;
  case 0x70:
    local_18 = ispunct(c);
    break;
  case 0x73:
    local_18 = isspace(c);
    break;
  case 0x75:
    local_18 = isupper(c);
    break;
  case 0x77:
    local_18 = isalnum(c);
    break;
  case 0x78:
    local_18 = isxdigit(c);
    break;
  case 0x7a:
    local_18 = (uint)(c == 0);
  }
  iVar1 = islower(cl);
  if (iVar1 == 0) {
    local_24 = (uint)((local_18 != 0 ^ 0xffU) & 1);
  }
  else {
    local_24 = local_18;
  }
  return local_24;
}

Assistant:

static int match_class (int c, int cl) {
  int res;
  switch (tolower(cl)) {
    case 'a' : res = isalpha(c); break;
    case 'c' : res = iscntrl(c); break;
    case 'd' : res = isdigit(c); break;
    case 'g' : res = isgraph(c); break;
    case 'l' : res = islower(c); break;
    case 'p' : res = ispunct(c); break;
    case 's' : res = isspace(c); break;
    case 'u' : res = isupper(c); break;
    case 'w' : res = isalnum(c); break;
    case 'x' : res = isxdigit(c); break;
    case 'z' : res = (c == 0); break;  /* deprecated option */
    default: return (cl == c);
  }
  return (islower(cl) ? res : !res);
}